

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

bool __thiscall
Catch::RunContext::sectionStarted(RunContext *this,SectionInfo *sectionInfo,Counts *assertions)

{
  uint uVar1;
  ostream *poVar2;
  SectionTracker *pSVar3;
  IStreamingReporter *pIVar4;
  undefined8 *in_RDX;
  string *in_RSI;
  long in_RDI;
  ITracker *sectionTracker;
  ostringstream oss;
  SourceLineInfo *in_stack_fffffffffffffdd8;
  SourceLineInfo *in_stack_fffffffffffffde0;
  undefined4 in_stack_fffffffffffffe28;
  undefined4 in_stack_fffffffffffffe2c;
  TrackerContext *in_stack_fffffffffffffe30;
  ostringstream local_198 [376];
  undefined8 *local_20;
  string *local_18;
  byte local_1;
  
  local_20 = in_RDX;
  local_18 = in_RSI;
  std::__cxx11::ostringstream::ostringstream(local_198);
  poVar2 = std::operator<<((ostream *)local_198,local_18);
  std::operator<<(poVar2,"@");
  Catch::operator<<((ostream *)in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
  std::__cxx11::ostringstream::str();
  pSVar3 = TestCaseTracking::SectionTracker::acquire
                     (in_stack_fffffffffffffe30,
                      (string *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffe30);
  uVar1 = (*(pSVar3->super_TrackerBase).super_ITracker.super_SharedImpl<Catch::IShared>.
            super_IShared.super_NonCopyable._vptr_NonCopyable[7])();
  local_1 = (uVar1 & 1) != 0;
  if ((bool)local_1) {
    std::
    vector<Catch::TestCaseTracking::ITracker_*,_std::allocator<Catch::TestCaseTracking::ITracker_*>_>
    ::push_back((vector<Catch::TestCaseTracking::ITracker_*,_std::allocator<Catch::TestCaseTracking::ITracker_*>_>
                 *)in_stack_fffffffffffffde0,(value_type *)in_stack_fffffffffffffdd8);
    SourceLineInfo::operator=(in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
    pIVar4 = Ptr<Catch::IStreamingReporter>::operator->
                       ((Ptr<Catch::IStreamingReporter> *)(in_RDI + 0x140));
    (*(pIVar4->super_IShared).super_NonCopyable._vptr_NonCopyable[9])(pIVar4,local_18);
    *local_20 = *(undefined8 *)(in_RDI + 0x110);
    local_20[1] = *(undefined8 *)(in_RDI + 0x118);
    local_20[2] = *(undefined8 *)(in_RDI + 0x120);
  }
  std::__cxx11::ostringstream::~ostringstream(local_198);
  return (bool)(local_1 & 1);
}

Assistant:

virtual bool sectionStarted (
            SectionInfo const& sectionInfo,
            Counts& assertions
        )
        {
            std::ostringstream oss;
            oss << sectionInfo.name << "@" << sectionInfo.lineInfo;

            ITracker& sectionTracker = SectionTracker::acquire( m_trackerContext, oss.str() );
            if( !sectionTracker.isOpen() )
                return false;
            m_activeSections.push_back( &sectionTracker );

            m_lastAssertionInfo.lineInfo = sectionInfo.lineInfo;

            m_reporter->sectionStarting( sectionInfo );

            assertions = m_totals.assertions;

            return true;
        }